

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

int __thiscall
ON_BinaryArchive::Internal_Read3dmTextStyle(ON_BinaryArchive *this,ON_TextStyle **ppTextStyle)

{
  ON_Object *pOVar1;
  bool bVar2;
  int iVar3;
  ON_TextStyle *model_component;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  uint local_34;
  ON_Object *local_30;
  ON__INT64 local_28;
  
  bVar2 = Read3dmTableRecord(this,text_style_table,ppTextStyle);
  if (!bVar2) {
    return 0;
  }
  local_34 = 0;
  local_28 = 0;
  bVar2 = BeginRead3dmBigChunk(this,&local_34,&local_28);
  if (!bVar2) {
    model_component = (ON_TextStyle *)0x0;
    goto LAB_003a4b14;
  }
  if (local_34 == 0xffffffff) {
    model_component = (ON_TextStyle *)0x0;
  }
  else {
    if (local_34 == 0x20008074) {
      Internal_Increment3dmTableItemCount(this);
      local_30 = (ON_Object *)0x0;
      iVar3 = ReadObjectHelper(this,&local_30);
      pOVar1 = local_30;
      if (iVar3 == 0) {
LAB_003a4ae1:
        model_component = (ON_TextStyle *)0x0;
      }
      else {
        model_component = ON_TextStyle::Cast(local_30);
        if (model_component == (ON_TextStyle *)0x0) {
          if (pOVar1 != (ON_Object *)0x0) {
            (*pOVar1->_vptr_ON_Object[4])(pOVar1);
          }
          goto LAB_003a4ae1;
        }
        Internal_Read3dmUpdateManifest(this,&model_component->super_ON_ModelComponent);
      }
      if (model_component != (ON_TextStyle *)0x0) goto LAB_003a4b0a;
      iVar3 = 0x299b;
    }
    else {
      model_component = (ON_TextStyle *)0x0;
      iVar3 = 0x299f;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,iVar3,"","ON_BinaryArchive::Read3dmTextStyle() - corrupt text_style table");
  }
LAB_003a4b0a:
  EndRead3dmChunk(this,false);
LAB_003a4b14:
  *ppTextStyle = model_component;
  return (uint)(model_component != (ON_TextStyle *)0x0);
}

Assistant:

int ON_BinaryArchive::Internal_Read3dmTextStyle( ON_TextStyle** ppTextStyle )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::text_style_table, (void**)ppTextStyle))
    return 0;

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  ON_TextStyle* text_style = nullptr;
  if ( BeginRead3dmBigChunk( &tcode, &big_value ) ) 
  {
    if ( tcode == TCODE_FONT_RECORD )
    {
      Internal_Increment3dmTableItemCount();
      ON_Object* p = 0;
      if ( ReadObject( &p ) ) 
      {
        text_style = ON_TextStyle::Cast(p);
        if ( !text_style )
          delete p;
        else
        {
          Internal_Read3dmUpdateManifest(*text_style);
        }
      }
      if (!text_style) {
        ON_ERROR("ON_BinaryArchive::Read3dmTextStyle() - corrupt text_style table");
      }
    }
    else if ( tcode != TCODE_ENDOFTABLE ) {
      ON_ERROR("ON_BinaryArchive::Read3dmTextStyle() - corrupt text_style table");
    }
    EndRead3dmChunk();
  }
  *ppTextStyle = text_style;
  return (text_style) ? 1 : 0;
}